

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

bool __thiscall
EnvironmentNAVXYTHETALATTICE::InitializeEnv
          (EnvironmentNAVXYTHETALATTICE *this,char *sEnvFile,
          vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *perimeterptsV,char *sMotPrimFile)

{
  byte bVar1;
  undefined4 uVar2;
  ostream *poVar3;
  undefined8 uVar4;
  FILE *__stream;
  undefined8 *puVar5;
  void *pvVar6;
  SBPL_Exception *this_00;
  char *in_RCX;
  char *in_RSI;
  long *in_RDI;
  stringstream ss_1;
  FILE *fMotPrim;
  stringstream ss;
  FILE *fCfg;
  string *in_stack_fffffffffffffc08;
  SBPL_Exception *in_stack_fffffffffffffc10;
  stringstream local_378 [16];
  ostream local_368 [16];
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *in_stack_fffffffffffffca8;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *in_stack_fffffffffffffcb0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  FILE *local_28;
  char *local_20;
  char *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::operator=
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  fflush(_stdout);
  local_28 = fopen(local_10,"r");
  if (local_28 == (FILE *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar3 = std::operator<<(local_1a0,"ERROR: unable to open ");
    std::operator<<(poVar3,local_10);
    uVar4 = __cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    SBPL_Exception::SBPL_Exception(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    __cxa_throw(uVar4,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  (**(code **)(*in_RDI + 0x1b8))(in_RDI,local_28);
  fclose(local_28);
  if (local_20 == (char *)0x0) {
    (**(code **)(*in_RDI + 0x1d8))(in_RDI,0);
  }
  else {
    __stream = fopen(local_20,"r");
    if (__stream == (FILE *)0x0) {
      std::__cxx11::stringstream::stringstream(local_378);
      poVar3 = std::operator<<(local_368,"ERROR: unable to open ");
      std::operator<<(poVar3,local_20);
      uVar4 = __cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      SBPL_Exception::SBPL_Exception(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      __cxa_throw(uVar4,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    bVar1 = (**(code **)(*in_RDI + 0x268))(in_RDI,__stream);
    if ((bVar1 & 1) == 0) {
      uVar4 = __cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08);
      __cxa_throw(uVar4,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    uVar2 = (**(code **)(*in_RDI + 0x108))(in_RDI[0xe]);
    *(undefined4 *)((long)in_RDI + 0x3c) = uVar2;
    if ((*(int *)((long)in_RDI + 0x3c) < 0) || ((int)in_RDI[6] <= *(int *)((long)in_RDI + 0x3c))) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      pvVar6 = operator_new(0x10);
      SBPL_Exception::SBPL_Exception(in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08);
      *puVar5 = pvVar6;
      __cxa_throw(puVar5,&SBPL_Exception*::typeinfo,0);
    }
    uVar2 = (**(code **)(*in_RDI + 0x108))(in_RDI[0xf]);
    *(undefined4 *)(in_RDI + 9) = uVar2;
    if (((int)in_RDI[9] < 0) || ((int)in_RDI[6] <= (int)in_RDI[9])) {
      this_00 = (SBPL_Exception *)__cxa_allocate_exception(8);
      pvVar6 = operator_new(0x10);
      SBPL_Exception::SBPL_Exception(this_00,(char *)in_stack_fffffffffffffc08);
      *(void **)this_00 = pvVar6;
      __cxa_throw(this_00,&SBPL_Exception*::typeinfo,0);
    }
    (**(code **)(*in_RDI + 0x1d8))(in_RDI,in_RDI + 0x20);
    fclose(__stream);
  }
  return true;
}

Assistant:

bool EnvironmentNAVXYTHETALATTICE::InitializeEnv(
    const char* sEnvFile,
    const std::vector<sbpl_2Dpt_t>& perimeterptsV,
    const char* sMotPrimFile)
{
    EnvNAVXYTHETALATCfg.FootprintPolygon = perimeterptsV;

    SBPL_INFO("InitializeEnv start: sEnvFile=%s sMotPrimFile=%s\n", sEnvFile, sMotPrimFile);
    fflush(stdout);

    FILE* fCfg = fopen(sEnvFile, "r");
    if (fCfg == NULL) {
        std::stringstream ss;
        ss << "ERROR: unable to open " << sEnvFile;
        throw SBPL_Exception(ss.str());
    }

    ReadConfiguration(fCfg);
    fclose(fCfg);

    if (sMotPrimFile != NULL) {
        FILE* fMotPrim = fopen(sMotPrimFile, "r");
        if (fMotPrim == NULL) {
            std::stringstream ss;
            ss << "ERROR: unable to open " << sMotPrimFile;
            throw SBPL_Exception(ss.str());
        }
        if (ReadMotionPrimitives(fMotPrim) == false) {
            throw SBPL_Exception("ERROR: failed to read in motion primitive file");
        }

        EnvNAVXYTHETALATCfg.StartTheta = ContTheta2DiscNew(EnvNAVXYTHETALATCfg.StartTheta_rad);
        if (EnvNAVXYTHETALATCfg.StartTheta < 0 ||
            EnvNAVXYTHETALATCfg.StartTheta >= EnvNAVXYTHETALATCfg.NumThetaDirs)
        {
            throw new SBPL_Exception("ERROR: illegal start coordinates for theta");
        }
        EnvNAVXYTHETALATCfg.EndTheta = ContTheta2DiscNew(EnvNAVXYTHETALATCfg.EndTheta_rad);
        if (EnvNAVXYTHETALATCfg.EndTheta < 0 ||
            EnvNAVXYTHETALATCfg.EndTheta >= EnvNAVXYTHETALATCfg.NumThetaDirs)
        {
            throw new SBPL_Exception("ERROR: illegal goal coordinates for theta");
        }

        InitGeneral(&EnvNAVXYTHETALATCfg.mprimV);
        fclose(fMotPrim);
    }
    else {
        InitGeneral( NULL);
    }

    SBPL_PRINTF("size of env: %d by %d\n", EnvNAVXYTHETALATCfg.EnvWidth_c, EnvNAVXYTHETALATCfg.EnvHeight_c);

    return true;
}